

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dukvalue.h
# Opt level: O1

void __thiscall DukValue::push(DukValue *this)

{
  duk_context *ctx;
  DukException *this_00;
  DukException *pDVar1;
  byte bVar2;
  char *rhs;
  undefined **local_48;
  _Alloc_hider _Stack_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_30;
  
  if (this->mType - 1 < 8) {
    ctx = this->mContext;
    switch((uint)this->mType) {
    case 1:
      duk_push_undefined(ctx);
      return;
    case 2:
      duk_push_null(ctx);
      return;
    case 3:
      duk_push_boolean(ctx,(uint)(this->mPOD).boolean);
      return;
    case 4:
      duk_push_number(ctx,(this->mPOD).number);
      return;
    case 5:
      duk_push_lstring(ctx,(this->mString)._M_dataplus._M_p,(this->mString)._M_string_length);
      return;
    case 6:
      push_ref_array(ctx);
      duk_get_prop_index(ctx,-1,(this->mPOD).ref_array_idx);
      duk_remove(ctx,-2);
      return;
    case 8:
      duk_push_pointer(ctx,(this->mPOD).pointer);
      return;
    }
  }
  this_00 = (DukException *)__cxa_allocate_exception(0x28);
  _Stack_40._M_p = (pointer)&aStack_30;
  aStack_30._8_8_ = 0;
  local_48 = &PTR__DukException_0016b6b8;
  local_38 = 0;
  aStack_30._M_allocated_capacity = 0;
  pDVar1 = DukException::operator<<
                     ((DukException *)&local_48,"DukValue.push() not implemented for type (");
  bVar2 = this->mType - UNDEFINED;
  if (bVar2 < 9) {
    rhs = *(char **)(&DAT_0016b760 + (ulong)bVar2 * 8);
  }
  else {
    rhs = "?";
  }
  pDVar1 = DukException::operator<<(pDVar1,rhs);
  pDVar1 = DukException::operator<<(pDVar1,")");
  DukException::DukException(this_00,pDVar1);
  __cxa_throw(this_00,&DukException::typeinfo,DukException::~DukException);
}

Assistant:

inline void push() const {
		duk_context* ctx = mContext;

		switch (mType) {
		case UNDEFINED:
			duk_push_undefined(ctx);
			break;
		case NULLREF:
			duk_push_null(ctx);
			break;

		case BOOLEAN:
			duk_push_boolean(ctx, mPOD.boolean);
			break;

		case NUMBER:
			duk_push_number(ctx, mPOD.number);
			break;

		case STRING:
			duk_push_lstring(ctx, mString.data(), mString.size());
			break;

		case OBJECT:
			push_ref_array(ctx);
			duk_get_prop_index(ctx, -1, mPOD.ref_array_idx);
			duk_remove(ctx, -2);
			break;

		case POINTER:
			duk_push_pointer(ctx, mPOD.pointer);
			break;

		case BUFFER:
		case LIGHTFUNC:
		default:
			throw DukException() << "DukValue.push() not implemented for type (" << type_name() << ")";
		}
	}